

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O0

void __thiscall
gmath::RadialTangentialDistortion::RadialTangentialDistortion
          (RadialTangentialDistortion *this,int n)

{
  int *piVar1;
  Distortion *in_RDI;
  int local_10;
  int local_c [3];
  
  Distortion::Distortion(in_RDI);
  in_RDI->_vptr_Distortion = (_func_int **)&PTR__RadialTangentialDistortion_001468a8;
  local_10 = 3;
  piVar1 = std::min<int>(local_c,&local_10);
  *(int *)&in_RDI[1]._vptr_Distortion = *piVar1;
  in_RDI[2]._vptr_Distortion = (_func_int **)0x0;
  in_RDI[3]._vptr_Distortion = (_func_int **)0x0;
  in_RDI[4]._vptr_Distortion = (_func_int **)0x0;
  in_RDI[5]._vptr_Distortion = (_func_int **)0x0;
  in_RDI[6]._vptr_Distortion = (_func_int **)0x0;
  return;
}

Assistant:

RadialTangentialDistortion::RadialTangentialDistortion(int n)
{
  n=std::min(n, 3);

  kn=n;
  kd[0]=0;
  kd[1]=0;
  kd[2]=0;
  kd[3]=0;
  kd[4]=0;
}